

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * anon_unknown.dwarf_18c225::readSnippet(string *__return_storage_ptr__,string *snippetFile)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostringstream oss;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  size_type *local_3a0;
  size_type local_398;
  size_type local_390;
  undefined8 uStack_388;
  ios_base local_330 [264];
  long local_228 [2];
  streambuf local_218 [16];
  byte abStack_208 [488];
  
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c0,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp","");
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_3c0,"/snippets/");
  local_3e0._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p == paVar3) {
    local_3e0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_3e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  }
  else {
    local_3e0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_3e0._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_3e0,(snippetFile->_M_dataplus)._M_p,snippetFile->_M_string_length);
  local_3a0 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0 == paVar3) {
    local_390 = paVar3->_M_allocated_capacity;
    uStack_388 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_3a0 = &local_390;
  }
  else {
    local_390 = paVar3->_M_allocated_capacity;
  }
  local_398 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_228,(string *)&local_3a0,_S_in);
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,local_390 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a0);
    std::ostream::operator<<((ostream *)&local_3a0,local_218);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3a0);
    std::ios_base::~ios_base(local_330);
    psVar2 = (string *)std::ifstream::~ifstream(local_228);
    return psVar2;
  }
  __assert_fail("!ifs.fail()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x42d2,"std::string (anonymous namespace)::readSnippet(const std::string &)");
}

Assistant:

std::string readSnippet( std::string const & snippetFile )
  {
    std::ifstream ifs( std::string( BASE_PATH ) + "/snippets/" + snippetFile );
    assert( !ifs.fail() );
    std::ostringstream oss;
    oss << ifs.rdbuf();
    return oss.str();
  }